

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O2

char * mwStrdup(char *str,char *file,int line)

{
  size_t sVar1;
  void *__dest;
  char *pcVar2;
  
  if (str == (char *)0x0) {
    mwIncErr();
    mwWrite("strdup: <%ld> %s(%d), strdup(NULL) called\n",mwCounter,file,(ulong)(uint)line);
    mwFlush();
  }
  else {
    sVar1 = strlen(str);
    __dest = mwMalloc(sVar1 + 1,file,line);
    if (__dest != (void *)0x0) {
      pcVar2 = (char *)memcpy(__dest,str,sVar1 + 1);
      return pcVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

char *mwStrdup(const char *str, const char *file, int line)
{
	size_t len;
	char *newstring;

	MW_MUTEX_LOCK();

	if (str == NULL) {
		mwIncErr();
		mwWrite("strdup: <%ld> %s(%d), strdup(NULL) called\n",
				mwCounter, file, line);
		FLUSH();
		MW_MUTEX_UNLOCK();
		return NULL;
	}

	len = strlen(str) + 1;
	newstring = (char *) mwMalloc(len, file, line);
	if (newstring != NULL) {
		memcpy(newstring, str, len);
	}
	MW_MUTEX_UNLOCK();
	return newstring;
}